

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
          (ConcurrentQueue<_zframe_t_*,_MyTraits> *this,consumer_token_t *token,_zframe_t **item)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  __pointer_type pPVar4;
  ProducerBase *this_00;
  long in_RSI;
  long in_RDI;
  ProducerBase *ptr;
  __pointer_type tail;
  memory_order __b;
  _zframe_t **in_stack_ffffffffffffff30;
  ConcurrentQueueProducerTypelessBase *pCVar5;
  ProducerBase *in_stack_ffffffffffffff38;
  ProducerBase *local_b0;
  ProducerBase *local_60;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  memory_order in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  if (*(long *)(in_RSI + 0x18) != 0) {
    iVar2 = *(int *)(in_RSI + 4);
    piVar3 = (int *)(in_RDI + 0x260);
    in_stack_fffffffffffffff4 = 0;
    in_stack_fffffffffffffff0 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (in_stack_fffffffffffffff4 - 1U < 2) {
      in_stack_ffffffffffffffec = *piVar3;
    }
    else if (in_stack_fffffffffffffff4 == 5) {
      in_stack_ffffffffffffffec = *piVar3;
    }
    else {
      in_stack_ffffffffffffffec = *piVar3;
    }
    if (iVar2 == in_stack_ffffffffffffffec) goto LAB_001cfe60;
  }
  bVar1 = ConcurrentQueue<_zframe_t_*,_MyTraits>::update_current_producer_after_rotation
                    ((ConcurrentQueue<_zframe_t_*,_MyTraits> *)
                     CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                     (consumer_token_t *)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (!bVar1) {
    return false;
  }
LAB_001cfe60:
  bVar1 = ProducerBase::dequeue<_zframe_t*>(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if (bVar1) {
    iVar2 = *(int *)(in_RSI + 8) + 1;
    *(int *)(in_RSI + 8) = iVar2;
    if (iVar2 == 0x100) {
      LOCK();
      *(int *)(in_RDI + 0x260) = *(int *)(in_RDI + 0x260) + 1;
      UNLOCK();
    }
  }
  else {
    pPVar4 = std::atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ProducerBase_*>::load
                       ((atomic<moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ProducerBase_*>
                         *)in_stack_ffffffffffffff38,
                        (memory_order)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    if (*(long *)(in_RSI + 0x10) == 0) {
      local_b0 = (ProducerBase *)0x0;
    }
    else {
      local_b0 = (ProducerBase *)(*(long *)(in_RSI + 0x10) + -8);
    }
    local_60 = ConcurrentQueue<_zframe_t_*,_MyTraits>::ProducerBase::next_prod(local_b0);
    if (local_60 == (ProducerBase *)0x0) {
      local_60 = pPVar4;
    }
    while( true ) {
      if (*(long *)(in_RSI + 0x10) == 0) {
        this_00 = (ProducerBase *)0x0;
      }
      else {
        this_00 = (ProducerBase *)(*(long *)(in_RSI + 0x10) + -8);
      }
      if (local_60 == this_00) {
        return false;
      }
      bVar1 = ProducerBase::dequeue<_zframe_t*>(this_00,in_stack_ffffffffffffff30);
      if (bVar1) break;
      local_60 = ConcurrentQueue<_zframe_t_*,_MyTraits>::ProducerBase::next_prod(local_60);
      if (local_60 == (ProducerBase *)0x0) {
        local_60 = pPVar4;
      }
    }
    pCVar5 = (ConcurrentQueueProducerTypelessBase *)0x0;
    if (local_60 != (ProducerBase *)0x0) {
      pCVar5 = &local_60->super_ConcurrentQueueProducerTypelessBase;
    }
    *(ConcurrentQueueProducerTypelessBase **)(in_RSI + 0x10) = pCVar5;
    *(undefined4 *)(in_RSI + 8) = 1;
  }
  return true;
}

Assistant:

bool try_dequeue(consumer_token_t& token, U& item)
	{
		// The idea is roughly as follows:
		// Every 256 items from one producer, make everyone rotate (increase the global offset) -> this means the highest efficiency consumer dictates the rotation speed of everyone else, more or less
		// If you see that the global offset has changed, you must reset your consumption counter and move to your designated place
		// If there's no items where you're supposed to be, keep moving until you find a producer with some items
		// If the global offset has not changed but you've run out of items to consume, move over from your current position until you find an producer with something in it
		
		if (token.desiredProducer == nullptr || token.lastKnownGlobalOffset != globalExplicitConsumerOffset.load(std::memory_order_relaxed)) {
			if (!update_current_producer_after_rotation(token)) {
				return false;
			}
		}
		
		// If there was at least one non-empty queue but it appears empty at the time
		// we try to dequeue from it, we need to make sure every queue's been tried
		if (static_cast<ProducerBase*>(token.currentProducer)->dequeue(item)) {
			if (++token.itemsConsumedFromCurrent == EXPLICIT_CONSUMER_CONSUMPTION_QUOTA_BEFORE_ROTATE) {
				globalExplicitConsumerOffset.fetch_add(1, std::memory_order_relaxed);
			}
			return true;
		}
		
		auto tail = producerListTail.load(std::memory_order_acquire);
		auto ptr = static_cast<ProducerBase*>(token.currentProducer)->next_prod();
		if (ptr == nullptr) {
			ptr = tail;
		}
		while (ptr != static_cast<ProducerBase*>(token.currentProducer)) {
			if (ptr->dequeue(item)) {
				token.currentProducer = ptr;
				token.itemsConsumedFromCurrent = 1;
				return true;
			}
			ptr = ptr->next_prod();
			if (ptr == nullptr) {
				ptr = tail;
			}
		}
		return false;
	}